

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SupportVectorClassifier::SerializeWithCachedSizes
          (SupportVectorClassifier *this,CodedOutputStream *output)

{
  byte *pbVar1;
  Rep *pRVar2;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  uint *puVar6;
  Type *value;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong value_00;
  ulong uVar12;
  double *pdVar13;
  
  if (this->kernel_ != (Kernel *)0x0 &&
      this != (SupportVectorClassifier *)&_SupportVectorClassifier_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->kernel_->super_MessageLite,output);
  }
  if (0 < (this->numberofsupportvectorsperclass_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x12);
      iVar4 = output->buffer_size_;
    }
    else {
      *output->buffer_ = '\x12';
      output->buffer_ = output->buffer_ + 1;
      iVar4 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar4;
    }
    uVar11 = this->_numberofsupportvectorsperclass_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar11);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar8 = pbVar1;
      uVar9 = uVar11;
      if (0x7f < uVar11) {
        do {
          *pbVar8 = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar3 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar3);
      }
      *pbVar8 = (byte)uVar9;
      iVar4 = ((int)pbVar8 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    iVar4 = (this->numberofsupportvectorsperclass_).current_size_;
    if (0 < iVar4) {
      iVar10 = 0;
      do {
        puVar6 = (uint *)google::protobuf::RepeatedField<int>::Get
                                   (&this->numberofsupportvectorsperclass_,iVar10);
        value_00 = (ulong)(int)*puVar6;
        if (output->buffer_size_ < 10) {
          google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,value_00);
        }
        else {
          pbVar1 = output->buffer_;
          pbVar8 = pbVar1;
          uVar12 = value_00;
          if (0x7f < *puVar6) {
            do {
              *pbVar8 = (byte)uVar12 | 0x80;
              value_00 = uVar12 >> 7;
              pbVar8 = pbVar8 + 1;
              bVar3 = 0x3fff < uVar12;
              uVar12 = value_00;
            } while (bVar3);
          }
          *pbVar8 = (byte)value_00;
          iVar7 = ((int)pbVar8 - (int)pbVar1) + 1;
          output->buffer_ = output->buffer_ + iVar7;
          output->buffer_size_ = output->buffer_size_ - iVar7;
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 != iVar4);
    }
  }
  uVar5 = this->_oneof_case_[0];
  if (uVar5 == 3) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->supportVectors_).sparsesupportvectors_)->super_MessageLite,output);
    uVar5 = this->_oneof_case_[0];
  }
  if (uVar5 == 4) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&((this->supportVectors_).sparsesupportvectors_)->super_MessageLite,output);
  }
  iVar4 = (this->coefficients_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    iVar10 = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
                        (&(this->coefficients_).super_RepeatedPtrFieldBase,iVar10);
      google::protobuf::internal::WireFormatLite::WriteMessage(5,&value->super_MessageLite,output);
      iVar10 = iVar10 + 1;
    } while (iVar4 != iVar10);
  }
  if (0 < (this->rho_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x32);
      iVar4 = output->buffer_size_;
    }
    else {
      *output->buffer_ = '2';
      output->buffer_ = output->buffer_ + 1;
      iVar4 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar4;
    }
    uVar11 = this->_rho_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar11);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar8 = pbVar1;
      uVar9 = uVar11;
      if (0x7f < uVar11) {
        do {
          *pbVar8 = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar3 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar3);
      }
      *pbVar8 = (byte)uVar9;
      iVar4 = ((int)pbVar8 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    pRVar2 = (this->rho_).rep_;
    pdVar13 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      pdVar13 = (double *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteDoubleArray
              (pdVar13,(this->rho_).current_size_,output);
  }
  if (0 < (this->proba_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x3a);
      iVar4 = output->buffer_size_;
    }
    else {
      *output->buffer_ = ':';
      output->buffer_ = output->buffer_ + 1;
      iVar4 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar4;
    }
    uVar11 = this->_proba_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar11);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar8 = pbVar1;
      uVar9 = uVar11;
      if (0x7f < uVar11) {
        do {
          *pbVar8 = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar3 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar3);
      }
      *pbVar8 = (byte)uVar9;
      iVar4 = ((int)pbVar8 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    pRVar2 = (this->proba_).rep_;
    pdVar13 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      pdVar13 = (double *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteDoubleArray
              (pdVar13,(this->proba_).current_size_,output);
  }
  if (0 < (this->probb_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x42);
      iVar4 = output->buffer_size_;
    }
    else {
      *output->buffer_ = 'B';
      output->buffer_ = output->buffer_ + 1;
      iVar4 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar4;
    }
    uVar11 = this->_probb_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar11);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar8 = pbVar1;
      uVar9 = uVar11;
      if (0x7f < uVar11) {
        do {
          *pbVar8 = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar3 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar3);
      }
      *pbVar8 = (byte)uVar9;
      iVar4 = ((int)pbVar8 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    pRVar2 = (this->probb_).rep_;
    pdVar13 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      pdVar13 = (double *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteDoubleArray
              (pdVar13,(this->probb_).current_size_,output);
  }
  uVar5 = this->_oneof_case_[1];
  if (uVar5 == 100) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
    uVar5 = this->_oneof_case_[1];
  }
  if (uVar5 != 0x65) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteMessage
            (0x65,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  return;
}

Assistant:

void SupportVectorClassifier::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SupportVectorClassifier)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->has_kernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->kernel_, output);
  }

  // repeated int32 numberOfSupportVectorsPerClass = 2;
  if (this->numberofsupportvectorsperclass_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_numberofsupportvectorsperclass_cached_byte_size_);
  }
  for (int i = 0, n = this->numberofsupportvectorsperclass_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->numberofsupportvectorsperclass(i), output);
  }

  // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 3;
  if (has_sparsesupportvectors()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *supportVectors_.sparsesupportvectors_, output);
  }

  // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 4;
  if (has_densesupportvectors()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *supportVectors_.densesupportvectors_, output);
  }

  // repeated .CoreML.Specification.Coefficients coefficients = 5;
  for (unsigned int i = 0, n = this->coefficients_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      5, this->coefficients(i), output);
  }

  // repeated double rho = 6;
  if (this->rho_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(6, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_rho_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->rho().data(), this->rho_size(), output);
  }

  // repeated double probA = 7;
  if (this->proba_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(7, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_proba_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->proba().data(), this->proba_size(), output);
  }

  // repeated double probB = 8;
  if (this->probb_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(8, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_probb_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->probb().data(), this->probb_size(), output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *ClassLabels_.stringclasslabels_, output);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (has_int64classlabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *ClassLabels_.int64classlabels_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SupportVectorClassifier)
}